

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

vm_obj_id_t CVmObjFile::create(int in_root_set)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t in_EDI;
  vm_obj_id_t id;
  
  vVar1 = vm_new_id(in_root_set,id,in_EDI);
  CVmObject::operator_new(CONCAT44(in_root_set,id),in_EDI);
  CVmObjFile((CVmObjFile *)CONCAT44(in_root_set,id));
  CVmObjTable::set_obj_transient((CVmObjTable *)CONCAT44(in_root_set,id),in_EDI);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjFile::create(VMG_ int in_root_set)
{
    /* instantiate the object */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    new (vmg_ id) CVmObjFile();

    /* files are always transient */
    G_obj_table->set_obj_transient(id);

    /* return the new ID */
    return id;
}